

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O0

void test_invalids(void)

{
  bool bVar1;
  cs_err cVar2;
  undefined8 *puVar3;
  char *__ptr;
  size_t count_00;
  ulong local_1f0;
  size_t k;
  char *hex_str;
  invalid_code *invalid_code;
  cs_err err;
  size_t count;
  int j;
  int i;
  cs_insn *insn;
  uint64_t address;
  invalid_instructions *invalid;
  invalid_instructions invalids [1];
  
  memcpy(&invalid,&DAT_002d4940,0x198);
  address = 0;
  insn = (cs_insn *)0x1000;
  printf("\nShould be invalid\n-----------------\n");
  bVar1 = false;
  while (!bVar1) {
    address = (uint64_t)&invalid;
    cVar2 = cs_open((cs_arch)invalid,invalid._4_4_,&handle);
    if (cVar2 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      cs_option(handle,CS_OPT_SYNTAX,3);
      for (count._0_4_ = 0; (int)count < *(int *)(address + 0x10); count._0_4_ = (int)count + 1) {
        puVar3 = (undefined8 *)(address + 0x18 + (long)(int)count * 0x18);
        __ptr = hex_string((uchar *)*puVar3,(int)puVar3[1]);
        printf("%s %s: %s\n",*(undefined8 *)(address + 8),__ptr,puVar3[2]);
        free(__ptr);
        count_00 = cs_disasm(handle,(uint8_t *)*puVar3,puVar3[1],(uint64_t)insn,0,(cs_insn **)&j);
        if (count_00 == 0) {
          printf("    SUCCESS: invalid\n");
        }
        else {
          printf("    ERROR:\n");
          for (local_1f0 = 0; local_1f0 < count_00; local_1f0 = local_1f0 + 1) {
            printf("    0x%lx:\t%s\t%s\n",_j[local_1f0].address,_j[local_1f0].mnemonic,
                   _j[local_1f0].op_str);
            print_insn_detail(_j + local_1f0);
          }
          cs_free(_j,count_00);
        }
      }
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar2);
    }
    bVar1 = true;
  }
  return;
}

Assistant:

static void test_invalids()
{
	struct invalid_instructions invalids[] = {{
		CS_ARCH_ARM,
			CS_MODE_THUMB,
			"Thumb",
			1,
			{{
				 (unsigned char *)"\xbd\xe8\x1e\xff",
				 4,
				 "invalid thumb2 pop because sp used and because both pc and lr are "
					 "present at the same time"
			 }},
	}};

	struct invalid_instructions * invalid = NULL;

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	int j;
	size_t count;

	printf("\nShould be invalid\n"
			"-----------------\n");

	for (i = 0; i < sizeof(invalids)/sizeof(invalids[0]); i++) {
		cs_err err;

		invalid = invalids + i;
		err = cs_open(invalid->arch, invalid->mode, &handle);

		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);
		cs_option(handle, CS_OPT_SYNTAX, CS_OPT_SYNTAX_NOREGNAME);

		for (j = 0; j < invalid->num_invalid_codes; ++j) {
			struct invalid_code * invalid_code = NULL;
			char * hex_str = NULL;

			invalid_code = invalid->invalid_codes + j;

			hex_str = hex_string(invalid_code->code, invalid_code->size);

			printf("%s %s: %s\n", invalid->platform_comment, hex_str, invalid_code->comment);

			free(hex_str);

			count = cs_disasm(handle,
					invalid_code->code, invalid_code->size, address, 0, &insn
					);

			if (count) {
				size_t k;
				printf("    ERROR:\n");

				for (k = 0; k < count; k++) {
					printf("    0x%"PRIx64":\t%s\t%s\n", 
							insn[k].address, insn[k].mnemonic, insn[k].op_str);
					print_insn_detail(&insn[k]);
				}
				cs_free(insn, count);

			} else {
				printf("    SUCCESS: invalid\n");
			}
		}

		cs_close(&handle);
	}
}